

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsrpacket.h
# Opt level: O2

int32_t __thiscall jrtplib::RTCPSRPacket::GetLostPacketCount(RTCPSRPacket *this,int index)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = 0;
  if ((this->super_RTCPPacket).knownformat == true) {
    puVar3 = (this->super_RTCPPacket).data;
    uVar2 = *(ushort *)(puVar3 + (long)index * 0x18 + 0x22);
    uVar6 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
    bVar1 = puVar3[(long)index * 0x18 + 0x21];
    iVar4 = (uint)bVar1 * 0x10000;
    iVar5 = iVar4 + uVar6 + -0x1000000;
    if (-1 < (char)bVar1) {
      iVar5 = uVar6 + iVar4;
    }
  }
  return iVar5;
}

Assistant:

inline int32_t RTCPSRPacket::GetLostPacketCount(int index) const
{
	if (!knownformat)
		return 0;
	RTCPReceiverReport *r = GotoReport(index);
	uint32_t count = ((uint32_t)r->packetslost[2])|(((uint32_t)r->packetslost[1])<<8)|(((uint32_t)r->packetslost[0])<<16);
	if ((count&0x00800000) != 0) // test for negative number
		count |= 0xFF000000;
	int32_t *count2 = (int32_t *)(&count);
	return (*count2);
}